

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

void __thiscall
jsoncons::stream_source<unsigned_char>::stream_source
          (stream_source<unsigned_char> *this,stream_source<unsigned_char> *other)

{
  basic_streambuf<char,_std::char_traits<char>_> **ppbVar1;
  basic_streambuf<char,_std::char_traits<char>_> *pbVar2;
  uchar *puVar3;
  uchar *puVar4;
  long in_RSI;
  stream_source<unsigned_char> *in_RDI;
  stream_source<unsigned_char> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe28;
  long lVar5;
  basic_null_istream<char> *in_stack_fffffffffffffe30;
  stream_source<unsigned_char> *in_stack_ffffffffffffffd8;
  stream_source<unsigned_char> *in_stack_ffffffffffffffe0;
  
  basic_null_istream<char>::basic_null_istream(in_stack_fffffffffffffe30);
  in_RDI->stream_ptr_ = (basic_istream<char,_std::char_traits<char>_> *)in_RDI;
  ppbVar1 = &in_RDI->sbuf_;
  pbVar2 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
  *ppbVar1 = pbVar2;
  in_RDI->position_ = 0;
  memset(&in_RDI->buffer_,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x227cea);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x227cfb);
  in_RDI->buffer_data_ = puVar3;
  in_RDI->buffer_length_ = 0;
  if (*(long *)(in_RSI + 0x158) != in_RSI) {
    in_RDI->stream_ptr_ = *(basic_istream<char,_std::char_traits<char>_> **)(in_RSI + 0x158);
    in_RDI->sbuf_ = *(basic_streambuf<char,_std::char_traits<char>_> **)(in_RSI + 0x160);
    in_RDI->position_ = *(size_t *)(in_RSI + 0x168);
    this_00 = (stream_source<unsigned_char> *)&in_RDI->buffer_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x227da6);
    lVar5 = *(long *)(in_RSI + 0x188);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x227dcb);
    in_RDI->buffer_data_ = puVar3 + (lVar5 - (long)puVar4);
    in_RDI->buffer_length_ = *(size_t *)(in_RSI + 400);
    stream_source(in_RDI);
    operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    ~stream_source(this_00);
  }
  return;
}

Assistant:

stream_source(stream_source&& other) noexcept
            : stream_ptr_(&null_is_), sbuf_(null_is_.rdbuf()),
              buffer_(), buffer_data_(buffer_.data())
        {
            if (other.stream_ptr_ != &other.null_is_)
            {
                stream_ptr_ = other.stream_ptr_;
                sbuf_ = other.sbuf_;
                position_ = other.position_;
                buffer_ = std::move(other.buffer_);
                buffer_data_ = buffer_.data() + (other.buffer_data_ - other.buffer_.data());
                buffer_length_ =  other.buffer_length_;
                other = stream_source();
            }
        }